

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_xar.c
# Opt level: O0

int file_new(archive_write *a,archive_entry *entry,file_conflict **newfile)

{
  wchar_t wVar1;
  mode_t mVar2;
  int *piVar3;
  void *pvVar4;
  la_int64_t lVar5;
  char *__s;
  size_t sVar6;
  time_t tVar7;
  long lVar8;
  char *linkpath;
  size_t sStack_48;
  int ret;
  size_t u16len;
  char *u16;
  file_conflict *file;
  _7zip_conflict *zip;
  file_conflict **newfile_local;
  archive_entry *entry_local;
  archive_write *a_local;
  
  linkpath._4_4_ = 0;
  file = (file_conflict *)a->format_data;
  *newfile = (file_conflict *)0x0;
  zip = (_7zip_conflict *)newfile;
  newfile_local = (file_conflict **)entry;
  entry_local = (archive_entry *)a;
  u16 = (char *)calloc(1,0x80);
  if (u16 == (char *)0x0) {
    archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory");
    a_local._4_4_ = -0x1e;
  }
  else {
    wVar1 = _archive_entry_pathname_l
                      ((archive_entry *)newfile_local,(char **)&u16len,&stack0xffffffffffffffb8,
                       (archive_string_conv *)file[2].rbnode.rb_nodes[1]);
    if (wVar1 < L'\0') {
      piVar3 = __errno_location();
      if (*piVar3 == 0xc) {
        free(u16);
        archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for UTF-16LE");
        return -0x1e;
      }
      archive_set_error((archive *)entry_local,-1,
                        "A filename cannot be converted to UTF-16LE;You should disable making Joliet extension"
                       );
      linkpath._4_4_ = -0x14;
    }
    pvVar4 = malloc(sStack_48 + 2);
    *(void **)(u16 + 0x28) = pvVar4;
    if (*(long *)(u16 + 0x28) == 0) {
      free(u16);
      archive_set_error((archive *)entry_local,0xc,"Can\'t allocate memory for Name");
      a_local._4_4_ = -0x1e;
    }
    else {
      memcpy(*(void **)(u16 + 0x28),(void *)u16len,sStack_48);
      *(undefined1 *)(*(long *)(u16 + 0x28) + sStack_48) = 0;
      *(undefined1 *)(*(long *)(u16 + 0x28) + 1 + sStack_48) = 0;
      *(int *)(u16 + 0x20) = (int)sStack_48;
      mVar2 = archive_entry_mode((archive_entry *)newfile_local);
      *(mode_t *)(u16 + 0x70) = mVar2;
      mVar2 = archive_entry_filetype((archive_entry *)newfile_local);
      if (mVar2 == 0x8000) {
        lVar5 = archive_entry_size((archive_entry *)newfile_local);
        *(la_int64_t *)(u16 + 0x30) = lVar5;
      }
      else {
        archive_entry_set_size((archive_entry *)newfile_local,0);
      }
      mVar2 = archive_entry_filetype((archive_entry *)newfile_local);
      if (mVar2 == 0x4000) {
        u16[0x78] = u16[0x78] & 0xfeU | 1;
      }
      else {
        mVar2 = archive_entry_filetype((archive_entry *)newfile_local);
        if (mVar2 == 0xa000) {
          __s = archive_entry_symlink_utf8((archive_entry *)newfile_local);
          if (__s == (char *)0x0) {
            free(u16);
            archive_set_error((archive *)entry_local,-1,
                              "symlink path could not be converted to UTF-8");
            return -0x19;
          }
          sVar6 = strlen(__s);
          *(size_t *)(u16 + 0x30) = sVar6;
        }
      }
      wVar1 = archive_entry_mtime_is_set((archive_entry *)newfile_local);
      if (wVar1 != L'\0') {
        *(uint *)(u16 + 0x38) = *(uint *)(u16 + 0x38) | 1;
        tVar7 = archive_entry_mtime((archive_entry *)newfile_local);
        *(time_t *)(u16 + 0x40) = tVar7;
        lVar8 = archive_entry_mtime_nsec((archive_entry *)newfile_local);
        *(long *)(u16 + 0x48) = lVar8;
      }
      wVar1 = archive_entry_atime_is_set((archive_entry *)newfile_local);
      if (wVar1 != L'\0') {
        *(uint *)(u16 + 0x38) = *(uint *)(u16 + 0x38) | 2;
        tVar7 = archive_entry_atime((archive_entry *)newfile_local);
        *(time_t *)(u16 + 0x50) = tVar7;
        lVar8 = archive_entry_atime_nsec((archive_entry *)newfile_local);
        *(long *)(u16 + 0x58) = lVar8;
      }
      wVar1 = archive_entry_ctime_is_set((archive_entry *)newfile_local);
      if (wVar1 != L'\0') {
        *(uint *)(u16 + 0x38) = *(uint *)(u16 + 0x38) | 4;
        tVar7 = archive_entry_ctime((archive_entry *)newfile_local);
        *(time_t *)(u16 + 0x60) = tVar7;
        lVar8 = archive_entry_ctime_nsec((archive_entry *)newfile_local);
        *(long *)(u16 + 0x68) = lVar8;
      }
      *(char **)zip = u16;
      a_local._4_4_ = linkpath._4_4_;
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
file_new(struct archive_read *a, struct xar *xar, struct xmlattr_list *list)
{
	struct xar_file *file;
	struct xmlattr *attr;

	file = calloc(1, sizeof(*file));
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM, "Out of memory");
		return (ARCHIVE_FATAL);
	}
	file->parent = xar->file;
	file->mode = 0777 | AE_IFREG;
	file->atime =  0;
	file->mtime = 0;
	xar->file = file;
	xar->xattr = NULL;
	for (attr = list->first; attr != NULL; attr = attr->next) {
		if (strcmp(attr->name, "id") == 0)
			file->id = atol10(attr->value, strlen(attr->value));
	}
	file->nlink = 1;
	if (heap_add_entry(a, &(xar->file_queue), file) != ARCHIVE_OK)
		return (ARCHIVE_FATAL);
	return (ARCHIVE_OK);
}